

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-connect-timeout.c
# Opt level: O1

int run_test_tcp_connect_timeout(void)

{
  sa_family_t sVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_connect_t *puVar3;
  uv_loop_t *puVar4;
  long lVar5;
  ulong uVar6;
  undefined8 unaff_RBX;
  int iVar7;
  char *pcVar8;
  uv_timer_t *puVar9;
  anon_union_28_2_e90107a3_for_address *paVar10;
  uv_loop_t *unaff_R14;
  bool bVar11;
  sockaddr_in addr;
  undefined1 auStack_4f0 [8];
  void *pvStack_4e8;
  sockaddr_in6 sStack_4e0;
  undefined8 uStack_4c0;
  uv_loop_t *puStack_4b8;
  void *pvStack_4a8;
  code *pcStack_4a0;
  undefined1 auStack_490 [27];
  undefined5 uStack_475;
  undefined3 uStack_470;
  char acStack_378 [768];
  code *pcStack_78;
  long lStack_68;
  long lStack_60;
  sockaddr_in sStack_58;
  undefined8 uStack_48;
  uv_loop_t *puStack_40;
  code *pcStack_38;
  code *pcStack_30;
  sockaddr_in local_20;
  
  pcVar8 = "8.8.8.8";
  iVar7 = 9999;
  pcStack_30 = (code *)0x17ccbd;
  iVar2 = uv_ip4_addr("8.8.8.8",9999,&local_20);
  if (iVar2 == 0) {
    pcStack_30 = (code *)0x17ccca;
    puVar3 = (uv_connect_t *)uv_default_loop();
    iVar7 = 0x34ec38;
    pcStack_30 = (code *)0x17ccd9;
    iVar2 = uv_timer_init((uv_loop_t *)puVar3,&timer);
    if (iVar2 != 0) goto LAB_0017cdb0;
    puVar9 = &timer;
    iVar7 = 0x17cdce;
    pcStack_30 = (code *)0x17ccfb;
    iVar2 = uv_timer_start(&timer,timer_cb,0x32,0);
    puVar3 = (uv_connect_t *)puVar9;
    if (iVar2 != 0) goto LAB_0017cdb5;
    pcStack_30 = (code *)0x17cd08;
    puVar3 = (uv_connect_t *)uv_default_loop();
    iVar7 = 0x34ecd0;
    pcStack_30 = (code *)0x17cd17;
    iVar2 = uv_tcp_init((uv_loop_t *)puVar3,&conn);
    if (iVar2 != 0) goto LAB_0017cdba;
    puVar3 = &connect_req;
    iVar7 = 0x34ecd0;
    pcStack_30 = (code *)0x17cd3e;
    iVar2 = uv_tcp_connect(&connect_req,&conn,(sockaddr *)&local_20,connect_cb);
    if (iVar2 != 0) {
      if (iVar2 == -0x65) {
        pcStack_30 = (code *)0x17cda4;
        run_test_tcp_connect_timeout_cold_7();
        return 1;
      }
      goto LAB_0017cdbf;
    }
    pcStack_30 = (code *)0x17cd47;
    puVar3 = (uv_connect_t *)uv_default_loop();
    iVar7 = 0;
    pcStack_30 = (code *)0x17cd51;
    iVar2 = uv_run((uv_loop_t *)puVar3,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0017cdc4;
    pcStack_30 = (code *)0x17cd5a;
    unaff_R14 = uv_default_loop();
    unaff_RBX._0_4_ = 0;
    unaff_RBX._4_4_ = 0;
    pcStack_30 = (code *)0x17cd70;
    uv_walk(unaff_R14,close_walk_cb,(void *)0x0);
    iVar7 = 0;
    pcStack_30 = (code *)0x17cd7a;
    uv_run(unaff_R14,UV_RUN_DEFAULT);
    pcStack_30 = (code *)0x17cd7f;
    puVar3 = (uv_connect_t *)uv_default_loop();
    pcStack_30 = (code *)0x17cd87;
    iVar2 = uv_loop_close((uv_loop_t *)puVar3);
    if (iVar2 == 0) {
      pcStack_30 = (code *)0x17cd90;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_30 = (code *)0x17cdb0;
    run_test_tcp_connect_timeout_cold_1();
    puVar3 = (uv_connect_t *)pcVar8;
LAB_0017cdb0:
    pcStack_30 = (code *)0x17cdb5;
    run_test_tcp_connect_timeout_cold_2();
LAB_0017cdb5:
    pcStack_30 = (code *)0x17cdba;
    run_test_tcp_connect_timeout_cold_3();
LAB_0017cdba:
    pcStack_30 = (code *)0x17cdbf;
    run_test_tcp_connect_timeout_cold_4();
LAB_0017cdbf:
    pcStack_30 = (code *)0x17cdc4;
    run_test_tcp_connect_timeout_cold_8();
LAB_0017cdc4:
    pcStack_30 = (code *)0x17cdc9;
    run_test_tcp_connect_timeout_cold_5();
  }
  pcStack_30 = timer_cb;
  run_test_tcp_connect_timeout_cold_6();
  pcStack_30 = (code *)unaff_RBX;
  if ((uv_timer_t *)puVar3 == &timer) {
    pcStack_38 = (code *)0x17cdf1;
    uv_close((uv_handle_t *)&conn,close_cb);
    uv_close((uv_handle_t *)&timer,close_cb);
    return extraout_EAX;
  }
  pcStack_38 = connect_cb;
  timer_cb_cold_1();
  if (puVar3 == &connect_req) {
    if (iVar7 == -0x7d) {
      connect_cb_called = connect_cb_called + 1;
      return extraout_EAX_00;
    }
  }
  else {
    puStack_40 = (uv_loop_t *)0x17ce25;
    connect_cb_cold_1();
  }
  puStack_40 = (uv_loop_t *)run_test_tcp_local_connect_timeout;
  connect_cb_cold_2();
  pcStack_78 = (code *)0x17ce36;
  uStack_48 = unaff_RBX;
  puStack_40 = unaff_R14;
  iVar2 = is_supported_system();
  if (iVar2 == 0) {
    pcStack_78 = (code *)0x17cfbf;
    run_test_tcp_local_connect_timeout_cold_9();
    return 1;
  }
  lStack_60 = 0;
  pcStack_78 = (code *)0x17ce5d;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_58);
  lStack_68 = (long)iVar2;
  if (lStack_60 == lStack_68) {
    pcStack_78 = (code *)0x17ce79;
    puVar4 = uv_default_loop();
    pcStack_78 = (code *)0x17ce88;
    iVar2 = uv_timer_init(puVar4,&timer);
    lStack_60 = (long)iVar2;
    lStack_68 = 0;
    if (lStack_60 != 0) goto LAB_0017cfdc;
    pcStack_78 = (code *)0x17cec2;
    iVar2 = uv_timer_start(&timer,timer_cb,1000,0);
    lStack_60 = (long)iVar2;
    lStack_68 = 0;
    if (lStack_60 != 0) goto LAB_0017cfeb;
    pcStack_78 = (code *)0x17cee7;
    puVar4 = uv_default_loop();
    pcStack_78 = (code *)0x17cef6;
    iVar2 = uv_tcp_init(puVar4,&conn);
    lStack_60 = (long)iVar2;
    lStack_68 = 0;
    if (lStack_60 != 0) goto LAB_0017cffa;
    pcStack_78 = (code *)0x17cf35;
    iVar2 = uv_tcp_connect(&connect_req,&conn,(sockaddr *)&sStack_58,connect_local_cb);
    if (iVar2 == -0x65) {
      pcStack_78 = (code *)0x17cfc6;
      run_test_tcp_local_connect_timeout_cold_8();
      return 1;
    }
    lStack_60 = (long)iVar2;
    lStack_68 = 0;
    if (lStack_60 != 0) goto LAB_0017d009;
    pcStack_78 = (code *)0x17cf63;
    puVar4 = uv_default_loop();
    pcStack_78 = (code *)0x17cf6d;
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0017d018;
    pcStack_78 = (code *)0x17cf7a;
    unaff_R14 = uv_default_loop();
    unaff_RBX._0_4_ = 0;
    unaff_RBX._4_4_ = 0;
    pcStack_78 = (code *)0x17cf90;
    uv_walk(unaff_R14,close_walk_cb,(void *)0x0);
    pcStack_78 = (code *)0x17cf9a;
    uv_run(unaff_R14,UV_RUN_DEFAULT);
    pcStack_78 = (code *)0x17cf9f;
    puVar4 = uv_default_loop();
    pcStack_78 = (code *)0x17cfa7;
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      pcStack_78 = (code *)0x17cfb0;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_78 = (code *)0x17cfdc;
    run_test_tcp_local_connect_timeout_cold_1();
LAB_0017cfdc:
    pcStack_78 = (code *)0x17cfeb;
    run_test_tcp_local_connect_timeout_cold_2();
LAB_0017cfeb:
    pcStack_78 = (code *)0x17cffa;
    run_test_tcp_local_connect_timeout_cold_3();
LAB_0017cffa:
    pcStack_78 = (code *)0x17d009;
    run_test_tcp_local_connect_timeout_cold_4();
LAB_0017d009:
    pcStack_78 = (code *)0x17d018;
    run_test_tcp_local_connect_timeout_cold_5();
LAB_0017d018:
    pcStack_78 = (code *)0x17d01d;
    run_test_tcp_local_connect_timeout_cold_6();
  }
  pcStack_78 = is_supported_system;
  run_test_tcp_local_connect_timeout_cold_7();
  pcStack_4a0 = (code *)0x17d034;
  pcStack_78 = (code *)unaff_RBX;
  iVar2 = uv_os_uname((uv_utsname_t *)(auStack_490 + 0x18));
  auStack_490._0_8_ = SEXT48(iVar2);
  auStack_490._16_8_ = (void *)0x0;
  if ((void *)auStack_490._0_8_ == (void *)0x0) {
    if (CONCAT35(uStack_470,uStack_475) == 0x544e5f73776f64 &&
        CONCAT53(uStack_475,auStack_490._24_3_) == 0x5f73776f646e6957) {
      pcStack_4a0 = (code *)0x17d0ae;
      iVar2 = sscanf(acStack_378,"%d.%d.%d",auStack_490,auStack_490 + 4,auStack_490 + 8);
      if (iVar2 != 3) {
        return 0;
      }
      lVar5 = 0;
      do {
        if (*(int *)((long)&DAT_001b13c4 + lVar5) < *(int *)(auStack_490 + lVar5)) {
          return 1;
        }
        if (*(int *)(auStack_490 + lVar5) < *(int *)((long)&DAT_001b13c4 + lVar5)) {
          return 0;
        }
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0xc);
    }
    return 1;
  }
  puVar3 = (uv_connect_t *)auStack_490;
  iVar2 = (int)auStack_490 + 0x10;
  pcStack_4a0 = connect_local_cb;
  is_supported_system_cold_1();
  if (puVar3 == &connect_req) {
    pcStack_4a0 = (code *)(long)iVar2;
    pvStack_4a8 = (void *)0xffffffffffffff83;
    if (pcStack_4a0 != (code *)0xffffffffffffff83) {
      connect_cb_called = connect_cb_called + 1;
      return iVar2;
    }
  }
  else {
    puStack_4b8 = (uv_loop_t *)0x17d125;
    connect_local_cb_cold_1();
  }
  puStack_4b8 = (uv_loop_t *)run_test_tcp6_local_connect_timeout;
  connect_local_cb_cold_2();
  uStack_4c0 = unaff_RBX;
  puStack_4b8 = unaff_R14;
  iVar2 = is_supported_system();
  if (iVar2 == 0) {
    run_test_tcp6_local_connect_timeout_cold_10();
    return 1;
  }
  iVar2 = uv_interface_addresses((uv_interface_address_t **)&sStack_4e0,(int *)auStack_4f0);
  if (iVar2 != 0) {
LAB_0017d344:
    run_test_tcp6_local_connect_timeout_cold_1();
    return 1;
  }
  if ((long)(int)auStack_4f0._0_4_ < 1) {
    uv_free_interface_addresses((uv_interface_address_t *)sStack_4e0._0_8_,auStack_4f0._0_4_);
    goto LAB_0017d344;
  }
  paVar10 = (anon_union_28_2_e90107a3_for_address *)(sStack_4e0._0_8_ + 0x14);
  uVar6 = 1;
  do {
    sVar1 = (paVar10->address4).sin_family;
    if (sVar1 == 10) break;
    paVar10 = (anon_union_28_2_e90107a3_for_address *)((long)paVar10 + 0x50);
    bVar11 = uVar6 < (ulong)(long)(int)auStack_4f0._0_4_;
    uVar6 = uVar6 + 1;
  } while (bVar11);
  uv_free_interface_addresses((uv_interface_address_t *)sStack_4e0._0_8_,auStack_4f0._0_4_);
  if (sVar1 != 10) goto LAB_0017d344;
  auStack_4f0 = (undefined1  [8])0x0;
  iVar2 = uv_ip6_addr("::1",9999,&sStack_4e0);
  pvStack_4e8 = (void *)(long)iVar2;
  if (auStack_4f0 == (undefined1  [8])pvStack_4e8) {
    puVar4 = uv_default_loop();
    iVar2 = uv_timer_init(puVar4,&timer);
    auStack_4f0 = (undefined1  [8])(long)iVar2;
    pvStack_4e8 = (void *)0x0;
    if (auStack_4f0 != (undefined1  [8])0x0) goto LAB_0017d36e;
    iVar2 = uv_timer_start(&timer,timer_cb,1000,0);
    auStack_4f0 = (undefined1  [8])(long)iVar2;
    pvStack_4e8 = (void *)0x0;
    if (auStack_4f0 != (undefined1  [8])0x0) goto LAB_0017d37d;
    puVar4 = uv_default_loop();
    iVar2 = uv_tcp_init(puVar4,&conn);
    auStack_4f0 = (undefined1  [8])(long)iVar2;
    pvStack_4e8 = (void *)0x0;
    if (auStack_4f0 != (undefined1  [8])0x0) goto LAB_0017d38c;
    iVar2 = uv_tcp_connect(&connect_req,&conn,(sockaddr *)&sStack_4e0,connect_local_cb);
    if (iVar2 == -0x65) {
      run_test_tcp6_local_connect_timeout_cold_9();
      return 1;
    }
    auStack_4f0 = (undefined1  [8])(long)iVar2;
    pvStack_4e8 = (void *)0x0;
    if (auStack_4f0 != (undefined1  [8])0x0) goto LAB_0017d39b;
    puVar4 = uv_default_loop();
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    auStack_4f0 = (undefined1  [8])(long)iVar2;
    pvStack_4e8 = (void *)0x0;
    if (auStack_4f0 == (undefined1  [8])0x0) {
      puVar4 = uv_default_loop();
      uv_walk(puVar4,close_walk_cb,(void *)0x0);
      uv_run(puVar4,UV_RUN_DEFAULT);
      puVar4 = uv_default_loop();
      iVar2 = uv_loop_close(puVar4);
      if (iVar2 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0017d3b9;
    }
  }
  else {
    run_test_tcp6_local_connect_timeout_cold_2();
LAB_0017d36e:
    run_test_tcp6_local_connect_timeout_cold_3();
LAB_0017d37d:
    run_test_tcp6_local_connect_timeout_cold_4();
LAB_0017d38c:
    run_test_tcp6_local_connect_timeout_cold_5();
LAB_0017d39b:
    run_test_tcp6_local_connect_timeout_cold_6();
  }
  puVar4 = (uv_loop_t *)auStack_4f0;
  run_test_tcp6_local_connect_timeout_cold_7();
LAB_0017d3b9:
  run_test_tcp6_local_connect_timeout_cold_8();
  if (puVar4 == (uv_loop_t *)&timer || puVar4 == (uv_loop_t *)&conn) {
    close_cb_called = close_cb_called + 1;
    return (int)CONCAT71(0x34ec,puVar4 == (uv_loop_t *)&conn);
  }
  close_cb_cold_1();
  iVar2 = uv_is_closing((uv_handle_t *)puVar4);
  if (iVar2 == 0) {
    uv_close((uv_handle_t *)puVar4,(uv_close_cb)0x0);
    return extraout_EAX_01;
  }
  return iVar2;
}

Assistant:

TEST_IMPL(tcp_connect_timeout) {
  struct sockaddr_in addr;
  int r;

  ASSERT(0 == uv_ip4_addr("8.8.8.8", 9999, &addr));

  r = uv_timer_init(uv_default_loop(), &timer);
  ASSERT(r == 0);

  r = uv_timer_start(&timer, timer_cb, 50, 0);
  ASSERT(r == 0);

  r = uv_tcp_init(uv_default_loop(), &conn);
  ASSERT(r == 0);

  r = uv_tcp_connect(&connect_req,
                     &conn,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  if (r == UV_ENETUNREACH)
    RETURN_SKIP("Network unreachable.");
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}